

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdWin.c
# Opt level: O2

void sat_solver_random_polarity(sat_solver *s)

{
  word wVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  
  iVar3 = 0;
  for (lVar4 = 0; lVar4 < s->size; lVar4 = lVar4 + 0x40) {
    wVar1 = Gia_ManRandomW(0);
    for (uVar2 = 0; (uVar2 != 0x40 && ((long)((long)iVar3 + uVar2) < (long)s->size));
        uVar2 = uVar2 + 1) {
      s->polarity[uVar2 + (long)iVar3] = (wVar1 >> (uVar2 & 0x3f) & 1) != 0;
    }
    iVar3 = iVar3 + 0x1000;
  }
  return;
}

Assistant:

static void sat_solver_random_polarity(sat_solver* s)
{
    int i, k;
    for ( i = 0; i < s->size; i += 64 )
    {
        word Polar = Gia_ManRandomW(0);
        for ( k = 0; k < 64 && (i << 6) + k < s->size; k++ )
            s->polarity[(i << 6) + k] = Abc_TtGetBit(&Polar, k);
    }
}